

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

bool embree::extend_grid(RTCGeometry geom,vector<bool,_std::allocator<bool>_> *visited,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *left,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *top,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *right)

{
  _Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*> *this;
  _Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*> *this_00;
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  reference puVar7;
  size_type sVar8;
  ulong uVar9;
  size_t i;
  ulong __n;
  reference rVar10;
  uint next_edge;
  ulong local_60;
  _Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*> *local_58;
  vector<bool,_std::allocator<bool>_> *local_50;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  size_type local_38;
  
  local_58 = &(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_start;
  uVar9 = 0;
  local_50 = visited;
  local_48 = right;
  local_40 = left;
  uVar6 = 0xffffffff;
  while( true ) {
    this = local_58;
    local_38 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::size(top);
    this_00 = local_58;
    local_60 = uVar9;
    if (local_38 <= uVar9) break;
    puVar7 = std::_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*>::operator[]
                       (this,uVar9);
    uVar2 = *puVar7;
    uVar1 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar2);
    uVar9 = local_60;
    if (uVar1 == uVar2) goto LAB_00146a21;
    uVar2 = rtcGetGeometryFace(geom,uVar1);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](local_50,(ulong)uVar2);
    if ((*rVar10._M_p & rVar10._M_mask) != 0) goto LAB_00146a21;
    if (uVar9 != 0) {
      uVar3 = rtcGetGeometryPreviousHalfEdge(geom,uVar6);
      iVar4 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar3);
      iVar5 = rtcGetGeometryNextHalfEdge(geom,uVar1);
      uVar9 = local_60;
      if (iVar4 != iVar5) goto LAB_00146a21;
    }
    uVar9 = uVar9 + 1;
    uVar6 = uVar1;
  }
  __n = 0;
  while( true ) {
    uVar9 = local_60;
    sVar8 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::size(top);
    if (sVar8 <= __n) break;
    puVar7 = std::_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*>::operator[]
                       (this_00,__n);
    uVar6 = rtcGetGeometryOppositeHalfEdge(geom,0,*puVar7);
    uVar2 = rtcGetGeometryFace(geom,uVar6);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](local_50,(ulong)uVar2);
    *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
    next_edge = uVar6;
    next_edge = rtcGetGeometryNextHalfEdge(geom,uVar6);
    if (__n == 0) {
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_48,&next_edge);
    }
    uVar6 = rtcGetGeometryNextHalfEdge(geom,next_edge);
    next_edge = uVar6;
    puVar7 = std::_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*>::operator[]
                       (this_00,__n);
    *puVar7 = uVar6;
    next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
    sVar8 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::size(top);
    if (__n == sVar8 - 1) {
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_front(local_40,&next_edge);
    }
    __n = __n + 1;
  }
LAB_00146a21:
  return local_38 <= uVar9;
}

Assistant:

bool extend_grid(RTCGeometry geom, std::vector<bool>& visited, std::deque<unsigned int>& left, std::deque<unsigned int>& top, std::deque<unsigned int>& right)
  {
    //        top
    // | <----------
    // |            /\ .
    // | left        | right 
    // |             |
    // \/            |

    
    /* test if all neighboring faces of top exist and are properly connected */
    unsigned int prev_opposite_edge = -1;
    for (size_t i=0; i<top.size(); i++)
    {
      const unsigned int edge = top[i];
      const unsigned int opposite_edge = rtcGetGeometryOppositeHalfEdge(geom,0,edge);
      if (opposite_edge == edge) return false;
      const unsigned int opposite_face = rtcGetGeometryFace(geom,opposite_edge);
      if (visited[opposite_face]) return false;

      /* test if we share an edge with the last quad */
      if (i > 0) {
        const unsigned int border0 = rtcGetGeometryOppositeHalfEdge(geom,0,rtcGetGeometryPreviousHalfEdge(geom,prev_opposite_edge));
        const unsigned int border1 = rtcGetGeometryNextHalfEdge(geom,opposite_edge);
        if (border0 != border1) return false;
      }
      prev_opposite_edge = opposite_edge;
    }

    /* extend border edges */
    for (size_t i=0; i<top.size(); i++)
    {
      const unsigned int edge = top[i];
      const unsigned int opposite_edge = rtcGetGeometryOppositeHalfEdge(geom,0,edge);
      assert(opposite_edge != edge);
      const unsigned int opposite_face = rtcGetGeometryFace(geom,opposite_edge);
      assert(!visited[opposite_face]);
      visited[opposite_face] = true;
      unsigned int next_edge = opposite_edge;
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      if (i == 0) right.push_back(next_edge);
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      top[i] = next_edge;
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      if (i == top.size()-1) left.push_front(next_edge);
    }

    return true;
  }